

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPermit::IfcPermit(IfcPermit *this)

{
  *(undefined ***)&this->field_0x110 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x118 = 0;
  *(char **)&this->field_0x120 = "IfcPermit";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00849338);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x849258;
  *(undefined8 *)&this->field_0x110 = 0x849320;
  *(undefined8 *)&this->field_0x88 = 0x849280;
  *(undefined8 *)&this->field_0x98 = 0x8492a8;
  *(undefined8 *)&this->field_0xd0 = 0x8492d0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8492f8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcPermit() : Object("IfcPermit") {}